

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot-brdf.cpp
# Opt level: O2

bool loadSamplesProgram(void)

{
  bool bVar1;
  GLenum GVar2;
  djg_program *program;
  char buf [1024];
  
  program = djgp_create();
  fwrite("Loading {Samples-Program}\n",0x1a,1,_stdout);
  fflush(_stdout);
  djgp_push_string(program,"#define BUFFER_BINDING_TRANSFORMS %i\n",1);
  if (g_sphere.samples.scheme == 1) {
    djgp_push_string(program,"#define SCHEME_GGX 1\n");
    strcat2(buf,g_app.dir.shader,"ggx.glsl");
    djgp_push_file(program,buf);
  }
  strcat2(buf,g_app.dir.shader,"samples.glsl");
  djgp_push_file(program,buf);
  bVar1 = djgp_to_gl(program,0x1c2,false,true,g_gl.programs + 4);
  if (bVar1) {
    djgp_release(program);
    g_gl.uniforms[0xf] = (*glad_glGetUniformLocation)(g_gl.programs[4],"u_Dir");
    g_gl.uniforms[0x10] = (*glad_glGetUniformLocation)(g_gl.programs[4],"u_Alpha");
    configureSamplesProgram();
    GVar2 = (*glad_glGetError)();
    bVar1 = GVar2 == 0;
  }
  else {
    fwrite("=> Failure <=\n",0xe,1,_stdout);
    fflush(_stdout);
    djgp_release(program);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool loadSamplesProgram()
{
    djg_program *djp = djgp_create();
    GLuint *program = &g_gl.programs[PROGRAM_SAMPLES];
    char buf[1024];

    LOG("Loading {Samples-Program}\n");
    djgp_push_string(djp, "#define BUFFER_BINDING_TRANSFORMS %i\n", STREAM_TRANSFORM);
    if (g_sphere.samples.scheme == SCHEME_GGX) {
        djgp_push_string(djp, "#define SCHEME_GGX 1\n");
        djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "ggx.glsl"));
    }
    djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "samples.glsl"));

    if (!djgp_to_gl(djp, 450, false, true, program)) {
        LOG("=> Failure <=\n");
        djgp_release(djp);

        return false;
    }
    djgp_release(djp);

    g_gl.uniforms[UNIFORM_SAMPLES_DIR] =
        glGetUniformLocation(g_gl.programs[PROGRAM_SAMPLES], "u_Dir");
    g_gl.uniforms[UNIFORM_SAMPLES_ALPHA] =
        glGetUniformLocation(g_gl.programs[PROGRAM_SAMPLES], "u_Alpha");

    configureSamplesProgram();

    return (glGetError() == GL_NO_ERROR);
}